

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmisaac.cpp
# Opt level: O0

void isaac_gen_group(isaacctx *ctx)

{
  uint uVar1;
  uint uVar2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  uint32_t uVar5;
  uint uVar6;
  uint32_t *puVar7;
  uint *puVar8;
  uint32_t *puVar9;
  uint32_t *mend;
  uint32_t *r;
  uint32_t *m2;
  uint32_t *mm;
  uint32_t *m;
  uint32_t y;
  uint32_t x;
  uint32_t b;
  uint32_t a;
  isaacctx *ctx_local;
  
  puVar3 = ctx->mem;
  r = ctx->rsl;
  a = ctx->a;
  uVar5 = ctx->c + 1;
  ctx->c = uVar5;
  b = ctx->b + uVar5;
  puVar4 = ctx->mem + 0x80;
  m2 = puVar4;
  m = puVar3;
  while (puVar7 = puVar3, m < puVar4) {
    uVar1 = *m;
    uVar2 = (a ^ a << 0xd) + *m2;
    uVar6 = puVar3[uVar1 >> 2 & 0xff] + uVar2 + b;
    *m = uVar6;
    uVar5 = puVar3[uVar6 >> 10 & 0xff] + uVar1;
    *r = uVar5;
    uVar1 = m[1];
    uVar2 = (uVar2 ^ uVar2 >> 6) + m2[1];
    uVar6 = puVar3[uVar1 >> 2 & 0xff] + uVar2 + uVar5;
    m[1] = uVar6;
    uVar5 = puVar3[uVar6 >> 10 & 0xff] + uVar1;
    r[1] = uVar5;
    uVar1 = m[2];
    puVar7 = m2 + 3;
    uVar2 = (uVar2 ^ uVar2 * 4) + m2[2];
    uVar6 = puVar3[uVar1 >> 2 & 0xff] + uVar2 + uVar5;
    puVar8 = m + 3;
    m[2] = uVar6;
    uVar5 = puVar3[uVar6 >> 10 & 0xff] + uVar1;
    puVar9 = r + 3;
    r[2] = uVar5;
    uVar1 = *puVar8;
    m2 = m2 + 4;
    a = (uVar2 ^ uVar2 >> 0x10) + *puVar7;
    uVar2 = puVar3[uVar1 >> 2 & 0xff] + a + uVar5;
    m = m + 4;
    *puVar8 = uVar2;
    b = puVar3[uVar2 >> 10 & 0xff] + uVar1;
    r = r + 4;
    *puVar9 = b;
  }
  while (m2 = puVar7, m2 < puVar4) {
    uVar1 = *m;
    uVar2 = (a ^ a << 0xd) + *m2;
    uVar6 = puVar3[uVar1 >> 2 & 0xff] + uVar2 + b;
    *m = uVar6;
    uVar5 = puVar3[uVar6 >> 10 & 0xff] + uVar1;
    *r = uVar5;
    uVar1 = m[1];
    uVar2 = (uVar2 ^ uVar2 >> 6) + m2[1];
    uVar6 = puVar3[uVar1 >> 2 & 0xff] + uVar2 + uVar5;
    m[1] = uVar6;
    uVar5 = puVar3[uVar6 >> 10 & 0xff] + uVar1;
    r[1] = uVar5;
    uVar1 = m[2];
    uVar2 = (uVar2 ^ uVar2 * 4) + m2[2];
    uVar6 = puVar3[uVar1 >> 2 & 0xff] + uVar2 + uVar5;
    puVar8 = m + 3;
    m[2] = uVar6;
    uVar5 = puVar3[uVar6 >> 10 & 0xff] + uVar1;
    puVar7 = r + 3;
    r[2] = uVar5;
    uVar1 = *puVar8;
    a = (uVar2 ^ uVar2 >> 0x10) + m2[3];
    uVar2 = puVar3[uVar1 >> 2 & 0xff] + a + uVar5;
    m = m + 4;
    *puVar8 = uVar2;
    b = puVar3[uVar2 >> 10 & 0xff] + uVar1;
    r = r + 4;
    *puVar7 = b;
    puVar7 = m2 + 4;
  }
  ctx->b = b;
  ctx->a = a;
  return;
}

Assistant:

void isaac_gen_group(isaacctx *ctx)
{
    uint32_t a;
    uint32_t b;
    uint32_t x;
    uint32_t y;
    uint32_t *m;
    uint32_t *mm;
    uint32_t *m2;
    uint32_t *r;
    uint32_t *mend;

    mm = ctx->mem;
    r = ctx->rsl;
    a = ctx->a;
    b = (ctx->b + (++ctx->c)) & 0xffffffff;
    for (m = mm, mend = m2 = m + (ISAAC_RANDSIZ/2) ; m<mend ; )
    {
        isaac_step(a<<13, a, b, mm, m, m2, r, x);
        isaac_step(a>>6,  a, b, mm, m, m2, r, x);
        isaac_step(a<<2,  a, b, mm, m, m2, r, x);
        isaac_step(a>>16, a, b, mm, m, m2, r, x);
    }
    for (m2 = mm; m2<mend; )
    {
        isaac_step(a<<13, a, b, mm, m, m2, r, x);
        isaac_step(a>>6,  a, b, mm, m, m2, r, x);
        isaac_step(a<<2,  a, b, mm, m, m2, r, x);
        isaac_step(a>>16, a, b, mm, m, m2, r, x);
    }
    ctx->b = b;
    ctx->a = a;
}